

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O0

int __thiscall sophia_interface::KLU(sophia_interface *this,int I,int J)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int *piVar6;
  bool bVar7;
  __type _Var8;
  bool local_92;
  int local_80 [4];
  int K3P;
  int K3M;
  int I2_2;
  int local_64;
  int I0;
  int I3_2;
  int I1_3;
  int I3_1;
  int I3;
  int KFAM;
  int I2_1;
  int ILP;
  int I1_2;
  int I1_1;
  int I2;
  int sgn_1;
  int sgn;
  int KQ;
  int I1;
  int KC;
  int KFA;
  int result;
  int J_local;
  int I_local;
  sophia_interface *this_local;
  
  KC = 0;
  I1 = 0;
  KQ = 0;
  if (((-1 < I) && (I <= MSTU[3])) && (0 < J)) {
    if ((I == 0) && (J == 1)) {
      KC = this->N;
    }
    else {
      KFA = J;
      _J_local = this;
      if ((I == 0) && ((J == 2 || (J == 6)))) {
        result = 0;
        for (sgn = 0; sgn < this->N; sgn = sgn + 1) {
          if (((KFA == 2) && (0 < this->K[0][sgn])) && (this->K[0][sgn] < 0xb)) {
            KC = KC + 1;
          }
          if (((KFA == 6) && (0 < this->K[0][sgn])) && (this->K[0][sgn] < 0xb)) {
            iVar5 = LUCHGE(this,this->K[1][sgn]);
            KC = iVar5 + KC;
          }
        }
      }
      else if (I != 0) {
        if (J < 6) {
          KC = this->K[J + -1][I + -1];
        }
        else {
          result = I;
          if (J == 6) {
            KC = LUCHGE(this,this->K[1][I + -1]);
          }
          else if (J < 9) {
            if ((0 < this->K[0][I + -1]) && (this->K[0][I + -1] < 0xb)) {
              KC = 1;
            }
            if (J == 8) {
              KC = this->K[1][I + -1] * KC;
            }
          }
          else if (J < 0xd) {
            I1 = this->K[1][I + -1];
            if (I1 < 1) {
              I1 = -I1;
            }
            iVar5 = LUCOMP(this,I1);
            sgn_1 = 0;
            if (iVar5 != 0) {
              sgn_1 = KCHG[1][iVar5 + -1];
            }
            if (((KFA == 9) && (iVar5 != 0)) && (sgn_1 != 0)) {
              KC = this->K[1][result + -1];
            }
            if (((KFA == 10) && (iVar5 != 0)) && (sgn_1 == 0)) {
              KC = this->K[1][result + -1];
            }
            if (KFA == 0xb) {
              KC = iVar5;
            }
            if (KFA == 0xc) {
              iVar5 = 1;
              if (this->K[1][result + -1] < 0) {
                iVar5 = -1;
              }
              KC = sgn_1 * iVar5;
            }
          }
          else if (J == 0xd) {
            I1 = this->K[1][I + -1];
            if (I1 < 1) {
              I1 = -I1;
            }
            lVar3 = (long)I1;
            _Var8 = std::pow<int,int>(-1,(int)((long)((ulong)(uint)((int)((long)I1 / 100) >> 0x1f)
                                                      << 0x20 | (long)I1 / 100 & 0xffffffffU) % 10))
            ;
            KC = (int)((double)(int)((long)((ulong)(uint)((int)(lVar3 / 100) >> 0x1f) << 0x20 |
                                           lVar3 / 100 & 0xffffffffU) % 10) * _Var8);
            if (I1 < 10) {
              KC = I1;
            }
            if ((int)((long)((ulong)(uint)((int)((long)I1 / 1000) >> 0x1f) << 0x20 |
                            (long)I1 / 1000 & 0xffffffffU) % 10) != 0) {
              KC = (int)((long)((ulong)(uint)((int)((long)I1 / 1000) >> 0x1f) << 0x20 |
                               (long)I1 / 1000 & 0xffffffffU) % 10);
            }
            iVar5 = 1;
            if (this->K[1][result + -1] < 0) {
              iVar5 = -1;
            }
            KC = KC * iVar5;
          }
          else {
            iVar5 = I;
            if (J < 0x10) {
              do {
                ILP = iVar5;
                KC = KC + 1;
                iVar5 = this->K[2][ILP + -1];
                bVar7 = false;
                if ((0 < iVar5) && (bVar7 = false, 0 < this->K[0][iVar5 + -1])) {
                  bVar7 = this->K[0][iVar5 + -1] < 0x15;
                }
              } while (bVar7);
              if (J == 0xf) {
                KC = ILP;
              }
            }
            else if (J == 0x10) {
              iVar5 = this->K[1][I + -1];
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              if ((this->K[0][I + -1] < 0x15) &&
                 ((((10 < iVar5 && (iVar5 < 0x15)) || (iVar5 == 0x16)) ||
                  ((100 < iVar5 &&
                   ((int)((long)((ulong)(uint)((int)((long)iVar5 / 10) >> 0x1f) << 0x20 |
                                (long)iVar5 / 10 & 0xffffffffU) % 10) != 0)))))) {
                bVar7 = true;
                iVar5 = I;
                do {
                  I2_1 = iVar5;
                  I1_3 = this->K[2][I2_1 + -1];
                  if (0 < I1_3) {
                    iVar5 = this->K[1][I1_3 + -1];
                    if (iVar5 < 1) {
                      iVar5 = -iVar5;
                    }
                    bVar2 = iVar5 < 0xb;
                    if (iVar5 < 0xb) {
                      bVar7 = false;
                    }
                    if (((bVar2 == true) || (bVar2 == true)) || ((bVar2 == true || (bVar2 == true)))
                       ) {
                      bVar7 = false;
                    }
                    if (100 < bVar2) {
                      bVar7 = false;
                    }
                  }
                  local_92 = bVar7 && 0 < I1_3;
                  iVar5 = I1_3;
                } while (local_92);
                if (this->K[0][I1_3 + -1] == 0xc) {
                  for (; I1_3 < I2_1; I1_3 = I1_3 + 1) {
                    if ((((this->K[2][I1_3] == this->K[2][I2_1 + -1]) && (this->K[1][I1_3] != 0x5b))
                        && (this->K[1][I1_3] != 0x5c)) && (this->K[1][I1_3] != 0x5d)) {
                      KC = KC + 1;
                    }
                  }
                }
                else {
                  I3_2 = I2_1;
                  do {
                    KC = KC + 1;
                    bVar7 = false;
                    if (I3_2 + 1 < this->N) {
                      bVar7 = this->K[2][I3_2] == this->K[2][I2_1 + -1];
                    }
                    I3_2 = I3_2 + 1;
                  } while (bVar7);
                }
              }
            }
            else if (J == 0x11) {
              KFA = 0x11;
              I0 = I;
              do {
                KC = KC + 1;
                local_64 = I0;
                I0 = this->K[2][I0 + -1];
                K3M = 1;
                piVar6 = std::max<int>(&K3M,&I0);
                I2_2 = *piVar6;
                KQ = LUCOMP(this,this->K[1][I2_2 + -1]);
                if ((((I0 == 0) || (this->K[0][I2_2 + -1] < 1)) || (0x14 < this->K[0][I2_2 + -1]))
                   || (KQ == 0)) {
                  if (KC == 1) {
                    KC = -1;
                  }
                  if (1 < KC) {
                    KC = 0;
                  }
                  return KC;
                }
              } while (KCHG[1][KQ + -1] == 0);
              if (this->K[0][I0 + -1] != 0xc) {
                return 0;
              }
              K3P = I0;
              do {
                iVar5 = K3P + 1;
                bVar7 = false;
                if (iVar5 < this->N) {
                  bVar7 = this->K[0][K3P] != 0xb;
                }
                K3P = iVar5;
              } while (bVar7);
              iVar1 = this->K[2][local_64 + -2];
              if ((I0 <= iVar1) && (iVar1 <= iVar5)) {
                KC = 0;
              }
              iVar1 = this->K[2][local_64];
              if (((local_64 < this->N) && (I0 <= iVar1)) && (iVar1 <= iVar5)) {
                KC = 0;
              }
            }
            else if (J == 0x12) {
              if ((this->K[0][I + -1] == 0xb) || (this->K[0][I + -1] == 0xc)) {
                local_80[1] = 0;
                local_80[0] = (this->K[4][I + -1] - this->K[3][I + -1]) + 1;
                piVar6 = std::max<int>(local_80 + 1,local_80);
                KC = *piVar6;
              }
              if ((this->K[3][result + -1] == 0) || (this->K[4][result + -1] == 0)) {
                KC = 0;
              }
            }
            else if (J < 0x17) {
              if (((this->K[0][I + -1] != 3) && (this->K[0][I + -1] != 0xd)) &&
                 (this->K[0][I + -1] != 0xe)) {
                return 0;
              }
              if (J == 0x13) {
                uVar4 = (long)this->K[3][I + -1] / (long)MSTU[4];
                KC = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) %
                          (long)MSTU[4]);
              }
              if (J == 0x14) {
                uVar4 = (long)this->K[4][I + -1] / (long)MSTU[4];
                KC = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) %
                          (long)MSTU[4]);
              }
              if (J == 0x15) {
                KC = this->K[3][I + -1] % MSTU[4];
              }
              if (J == 0x16) {
                KC = this->K[4][I + -1] % MSTU[4];
              }
            }
          }
        }
      }
    }
  }
  return KC;
}

Assistant:

int sophia_interface::KLU(int I, int J) {
// Purpose: to provide various integer-valued event related data.
    // Default value. For I=0 number of entries, number of stable entries
    // or 3 times total charge.
    int result = 0;
    int KFA = 0;
    int KC = 0;
    if (I < 0 || I > MSTU[3] || J <= 0) {
        // do nothing
    } else if (I == 0 && J == 1) {
        result = N;
    } else if (I == 0 && (J == 2 || J == 6)) {
        for (int I1 = 0; I1 < N; ++I1) {
            if (J == 2 && K[0][I1] >= 1 && K[0][I1] <= 10) result++;
            if (J == 6 && K[0][I1] >= 1 && K[0][I1] <= 10) result += LUCHGE(K[1][I1]);
        }
    } else if (I == 0) {
        // do nothing
    // For I > 0 direct readout of K matrix or charge.
    } else if (J <= 5) {
        result = K[J - 1][I - 1];
    } else if (J == 6) {
        result = LUCHGE(K[1][I - 1]);

    // Status (existing/fragmented/decayed), parton/hadron separation.
    } else if (J <= 8) {
        if (K[0][I - 1] >= 1 && K[0][I - 1] <= 10) result = 1;
        if (J == 8) result *= K[1][I - 1];
    } else if (J <= 12) {
        KFA = std::abs(K[1][I - 1]);
        KC = LUCOMP(KFA);
        int KQ = 0;
        if (KC != 0) KQ = KCHG[1][KC - 1];
        if (J == 9 && KC != 0 && KQ != 0) result = K[1][I - 1];
        if (J == 10 && KC != 0 && KQ == 0) result = K[1][I - 1];
        if (J == 11) result = KC;
        if (J == 12) {
            int sgn = (K[1][I - 1] < 0)? -1 : 1;
            result = KQ * sgn;
        }

    // Heaviest flavour in hadron/diquark.
    } else if (J == 13) {
        KFA = std::abs(K[1][I - 1]);
        result = (KFA / 100) % 10 * std::pow(-1, (KFA / 100) % 10);
        if (KFA < 10) result = KFA;
        if ((KFA / 1000) % 10 != 0) result = (KFA / 1000) % 10;
        int sgn = (K[1][I - 1] < 0)? -1 : 1;
        result = result * sgn;

    // Particle history: generation, ancestor, rank.
    } else if (J <= 15) {
        int I2 = I;
        int I1 = I;
        do {
            result++;
            I2 = I1;
            I1 = K[2][I1 - 1];
        } while (I1 > 0 && K[0][I1 - 1] > 0 && K[0][I1 - 1] <= 20);
        if (J == 15) result = I2;
    } else if (J == 16) {
        KFA = std::abs(K[1][I - 1]);
        if (K[0][I - 1] <= 20 && ((KFA >= 11 && KFA <= 20) || KFA == 22 || (KFA > 100 && (KFA / 10) % 10 != 0))) {
            int I1 = I;
            int ILP = 1;
            int I2 = I1;
            do {
                I2 = I1;
                I1 = K[2][I1 - 1];
                if (I1 > 0) {
                    int KFAM = std::abs(K[1][I1 - 1]);
                    if (KFAM =! 0 && KFAM <= 10) ILP = 0;
                    if (KFAM == 21 || KFAM == 91 || KFAM == 92 || KFAM == 93) ILP = 0;
                    if (KFAM > 100 && (KFAM / 10) % 10 == 0) ILP = 0;
                }
            } while (ILP == 1 && I1 > 0);

            if (K[0][I1 - 1] == 12) {
                for (int I3 = I1; I3 < I2; ++I3) {
                    if (K[2][I3] == K[2][I2 - 1] && K[1][I3] != 91 && K[1][I3] != 92 && K[1][I3] != 93) result++;
                }
            } else {
                int I3 = I2;
                do {
                    result++;
                    I3++;
                } while (I3 < N && K[2][I3 - 1] == K[2][I2 - 1]);
            }
        }

    // Particle coming from collapsing jet system or not.
    } else if (J == 17) {
        int I1 = I;
        int I3 = I1;
        do {
            result++;
            I3 = I1;
            I1 = K[2][I1 - 1];
            int I0 = std::max(1, I1);
            KC = LUCOMP(K[1][I0 - 1]);
            if (I1 == 0 || K[0][I0 - 1] <= 0 || K[0][I0 - 1] > 20 || KC == 0) {
                if (result == 1) result = -1;
                if (result > 1) result = 0;
                return result;
            }
        } while (KCHG[1][KC - 1] == 0);
        if (K[0][I1 - 1] != 12) return 0;
        int I2 = I1;
        do {
            I2++;
        } while (I2 < N && K[0][I2 - 1] != 11);
        int K3M = K[2][I3 - 2];
        if (K3M >= I1 && K3M <= I2) result = 0;
        int K3P = K[2][I3];
        if (I3 < N && K3P >= I1 && K3P <= I2) result = 0;

    // Number of decay products. Colour flow.
    } else if (J == 18) {
        if (K[0][I - 1] == 11 || K[0][I - 1] == 12) result = std::max(0, K[4][I - 1] - K[3][I - 1] + 1);
        if (K[3][I - 1] == 0 || K[4][I - 1] == 0) result = 0;
    } else if (J <= 22) {
        if (K[0][I - 1] != 3 && K[0][I - 1] != 13 && K[0][I - 1] != 14) return result; 
        if (J == 19) result = (K[3][I - 1] / MSTU[4]) % MSTU[4];
        if (J == 20) result = (K[4][I - 1] / MSTU[4]) % MSTU[4];
        if (J == 21) result = K[3][I - 1] % MSTU[4];
        if (J == 22) result = K[4][I - 1] % MSTU[4];
    }

    return result;
}